

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

void CreateDefaultConstructorCode
               (ExpressionContext *ctx,SynBase *source,TypeClass *classType,
               IntrusiveList<ExprBase> *expressions)

{
  MemberHandle *pMVar1;
  VariableData *variable;
  SynBase *pSVar2;
  TypeStruct *pTVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  bool bVar6;
  int iVar7;
  ExprBase *address;
  ExprBase *pEVar8;
  TypeRef *type;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ExprZeroInitialize *this;
  undefined4 extraout_var_01;
  ulong uVar9;
  TypeBase *pTVar10;
  SynBase *source_00;
  MemberHandle *pMVar11;
  InplaceStr name;
  InplaceStr local_50;
  SynBase *local_40;
  ExprBase *local_38;
  
  pMVar1 = (classType->super_TypeStruct).members.head;
  local_40 = source;
  do {
    if (pMVar1 == (MemberHandle *)0x0) {
      return;
    }
    variable = pMVar1->variable;
    if (classType->baseClass == (TypeClass *)0x0) {
LAB_0017f10a:
      bVar5 = false;
    }
    else {
      pMVar11 = (classType->baseClass->super_TypeStruct).members.head;
      if (pMVar11 == (MemberHandle *)0x0) {
LAB_0017f102:
        bVar5 = false;
        bVar6 = true;
      }
      else {
        do {
          bVar6 = InplaceStr::operator==(&variable->name->name,&pMVar11->variable->name->name);
          if (bVar6) break;
          pMVar11 = pMVar11->next;
        } while (pMVar11 != (MemberHandle *)0x0);
        if (!bVar6) goto LAB_0017f102;
        local_50.begin = "$typeid";
        local_50.end = "";
        bVar6 = InplaceStr::operator==(&variable->name->name,&local_50);
        if (bVar6) goto LAB_0017f102;
        bVar5 = true;
        bVar6 = false;
      }
      if (bVar6) goto LAB_0017f10a;
    }
    pSVar2 = local_40;
    if (!bVar5) {
      source_00 = pMVar1->source;
      if (pMVar1->source == (SynBase *)0x0) {
        source_00 = local_40;
      }
      uVar9 = 1;
      local_38 = CreateVariableAccess(ctx,source_00,variable,true);
      address = CreateGetAddress(ctx,pSVar2,local_38);
      local_50.begin = "$typeid";
      local_50.end = "";
      bVar6 = InplaceStr::operator==(&variable->name->name,&local_50);
      if (bVar6) {
        if (classType->baseClass != (TypeClass *)0x0) {
          bVar6 = HasDefaultConstructor(ctx,source_00,(TypeBase *)classType->baseClass);
          if (!bVar6) {
            __assert_fail("HasDefaultConstructor(ctx, memberSource, classType->baseClass)",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                          ,0x2783,
                          "void CreateDefaultConstructorCode(ExpressionContext &, SynBase *, TypeClass *, IntrusiveList<ExprBase> &)"
                         );
          }
          auVar4._8_8_ = 0;
          auVar4._0_8_ = uVar9;
          name.end = "";
          name.begin = "this";
          pEVar8 = CreateVariableAccess
                             (ctx,source_00,(IntrusiveList<SynIdentifier>)(auVar4 << 0x40),name,
                              false);
          if (pEVar8 == (ExprBase *)0x0) {
            anon_unknown.dwarf_c6b42::Stop
                      (ctx,source_00,"ERROR: \'this\' variable is not available");
          }
          type = ExpressionContext::GetReferenceType(ctx,(TypeBase *)classType->baseClass);
          pEVar8 = CreateCast(ctx,source_00,pEVar8,&type->super_TypeBase,true);
          pEVar8 = CreateDefaultConstructorCall
                             (ctx,source_00,(TypeBase *)classType->baseClass,pEVar8);
          if (pEVar8 != (ExprBase *)0x0) {
            IntrusiveList<ExprBase>::push_back(expressions,pEVar8);
          }
        }
        iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
        pEVar8 = (ExprBase *)CONCAT44(extraout_var,iVar7);
        pTVar10 = ctx->typeTypeID;
        pEVar8->typeID = 8;
        pEVar8->source = source_00;
        pEVar8->type = pTVar10;
        pEVar8->next = (ExprBase *)0x0;
        pEVar8->listed = false;
        pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248570;
        pEVar8[1]._vptr_ExprBase = (_func_int **)classType;
LAB_0017f37c:
        this = (ExprZeroInitialize *)CreateAssignment(ctx,source_00,address,pEVar8);
      }
      else {
        pSVar2 = pMVar1->initializer;
        if (pSVar2 == (SynBase *)0x0) {
          bVar6 = HasDefaultConstructor(ctx,source_00,variable->type);
          if (bVar6) {
            this = (ExprZeroInitialize *)
                   CreateDefaultConstructorCall(ctx,source_00,variable->type,address);
            if (this == (ExprZeroInitialize *)0x0) goto LAB_0017f38f;
          }
          else {
            iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
            this = (ExprZeroInitialize *)CONCAT44(extraout_var_01,iVar7);
            ExprZeroInitialize::ExprZeroInitialize(this,source_00,ctx->typeVoid,address);
          }
        }
        else {
          pEVar8 = AnalyzeExpression(ctx,pSVar2);
          pEVar8 = ResolveInitializerValue(ctx,pSVar2,pEVar8);
          pTVar10 = variable->type;
          if ((pTVar10 == (TypeBase *)0x0) || (pTVar10->typeID != 0x13)) {
            pTVar10 = (TypeBase *)0x0;
          }
          if (((pTVar10 == (TypeBase *)0x0) ||
              (((pTVar3 = (TypeStruct *)pEVar8->type, pTVar3 != (TypeStruct *)0x0 &&
                ((pTVar3->super_TypeBase).typeID == 0x13)) || (pTVar3 == ctx->typeAutoArray)))) ||
             (pTVar3 == ctx->typeAutoRef)) {
            source_00 = pEVar8->source;
            address = local_38;
            goto LAB_0017f37c;
          }
          pEVar8 = CreateCast(ctx,pEVar8->source,pEVar8,(TypeBase *)pTVar10[1]._vptr_TypeBase,false)
          ;
          iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
          this = (ExprZeroInitialize *)CONCAT44(extraout_var_00,iVar7);
          pSVar2 = pEVar8->source;
          pTVar10 = ctx->typeVoid;
          (this->super_ExprBase).typeID = 0x20;
          (this->super_ExprBase).source = pSVar2;
          (this->super_ExprBase).type = pTVar10;
          (this->super_ExprBase).next = (ExprBase *)0x0;
          (this->super_ExprBase).listed = false;
          (this->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248fc0;
          this->address = address;
          this[1].super_ExprBase._vptr_ExprBase = (_func_int **)pEVar8;
        }
      }
      IntrusiveList<ExprBase>::push_back(expressions,&this->super_ExprBase);
    }
LAB_0017f38f:
    pMVar1 = pMVar1->next;
  } while( true );
}

Assistant:

void CreateDefaultConstructorCode(ExpressionContext &ctx, SynBase *source, TypeClass *classType, IntrusiveList<ExprBase> &expressions)
{
	for(MemberHandle *el = classType->members.head; el; el = el->next)
	{
		VariableData *variable = el->variable;

		if(TypeClass *base = classType->baseClass)
		{
			bool found = false;

			for(MemberHandle *baseMember = base->members.head; baseMember && !found; baseMember = baseMember->next)
				found = variable->name->name == baseMember->variable->name->name;

			if(found && variable->name->name != InplaceStr("$typeid"))
				continue;
		}

		SynBase *memberSource = el->source ? el->source : source;

		ExprBase *access = CreateVariableAccess(ctx, memberSource, variable, true);

		ExprBase *member = CreateGetAddress(ctx, source, access);

		if(variable->name->name == InplaceStr("$typeid"))
		{
			if(classType->baseClass)
			{
				assert(HasDefaultConstructor(ctx, memberSource, classType->baseClass));

				ExprBase *thisAccess = CreateVariableAccess(ctx, memberSource, IntrusiveList<SynIdentifier>(), InplaceStr("this"), false);

				if(!thisAccess)
					Stop(ctx, memberSource, "ERROR: 'this' variable is not available");

				ExprBase *cast = CreateCast(ctx, memberSource, thisAccess, ctx.GetReferenceType(classType->baseClass), true);

				if(ExprBase *call = CreateDefaultConstructorCall(ctx, memberSource, classType->baseClass, cast))
					expressions.push_back(call);
			}

			expressions.push_back(CreateAssignment(ctx, memberSource, member, new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(memberSource, ctx.typeTypeID, classType)));
			continue;
		}

		if(el->initializer)
		{
			ExprBase *initializer = ResolveInitializerValue(ctx, el->initializer, AnalyzeExpression(ctx, el->initializer));

			TypeArray *arrType = getType<TypeArray>(variable->type);

			// Single-level array might be set with a single element at the point of definition
			if(arrType && !isType<TypeArray>(initializer->type) && initializer->type != ctx.typeAutoArray && initializer->type != ctx.typeAutoRef)
			{
				initializer = CreateCast(ctx, initializer->source, initializer, arrType->subType, false);

				expressions.push_back(new (ctx.get<ExprArraySetup>()) ExprArraySetup(initializer->source, ctx.typeVoid, member, initializer));
			}
			else
			{
				expressions.push_back(CreateAssignment(ctx, initializer->source, access, initializer));
			}
		}
		else if(HasDefaultConstructor(ctx, memberSource, variable->type))
		{
			if(ExprBase *call = CreateDefaultConstructorCall(ctx, memberSource, variable->type, member))
				expressions.push_back(call);
		}
		else
		{
			expressions.push_back(new (ctx.get<ExprZeroInitialize>()) ExprZeroInitialize(memberSource, ctx.typeVoid, member));
		}
	}
}